

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O1

void sad128x1(uint16_t *src_ptr,uint16_t *ref_ptr,uint16_t *sec_ptr,__m256i *sad_acc)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  bool bVar7;
  __m256i r [4];
  __m256i s [4];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  alVar1 = *sad_acc;
  iVar5 = 0;
  do {
    local_c0 = *(undefined1 (*) [32])src_ptr;
    local_a0 = *(undefined8 *)*(undefined1 (*) [32])((long)src_ptr + 0x20);
    uStack_98 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x20) + 8);
    uStack_90 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x20) + 0x10);
    uStack_88 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x20) + 0x18);
    local_80 = *(undefined8 *)*(undefined1 (*) [32])((long)src_ptr + 0x40);
    uStack_78 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x40) + 8);
    uStack_70 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x40) + 0x10);
    uStack_68 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x40) + 0x18);
    local_60 = *(undefined8 *)*(undefined1 (*) [32])((long)src_ptr + 0x60);
    uStack_58 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x60) + 8);
    uStack_50 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x60) + 0x10);
    uStack_48 = *(undefined8 *)(*(undefined1 (*) [32])((long)src_ptr + 0x60) + 0x18);
    local_140 = *(undefined1 (*) [32])ref_ptr;
    local_120 = *(undefined1 (*) [32])((long)ref_ptr + 0x20);
    local_100 = *(undefined1 (*) [32])((long)ref_ptr + 0x40);
    local_e0 = *(undefined1 (*) [32])((long)ref_ptr + 0x60);
    if ((undefined1 (*) [32])sec_ptr == (undefined1 (*) [32])0x0) {
      sec_ptr = (uint16_t *)0x0;
    }
    else {
      local_140 = vpavgw_avx2(*(undefined1 (*) [32])ref_ptr,*(undefined1 (*) [32])sec_ptr);
      local_120 = vpavgw_avx2(*(undefined1 (*) [32])((long)ref_ptr + 0x20),
                              *(undefined1 (*) [32])((long)sec_ptr + 0x20));
      local_100 = vpavgw_avx2(*(undefined1 (*) [32])((long)ref_ptr + 0x40),
                              *(undefined1 (*) [32])((long)sec_ptr + 0x40));
      local_e0 = vpavgw_avx2(*(undefined1 (*) [32])((long)ref_ptr + 0x60),
                             *(undefined1 (*) [32])((long)sec_ptr + 0x60));
      sec_ptr = (uint16_t *)((long)sec_ptr + 0x80);
    }
    lVar6 = 0;
    do {
      auVar2 = vpsubw_avx2(*(undefined1 (*) [32])(local_c0 + lVar6),
                           *(undefined1 (*) [32])(local_140 + lVar6));
      auVar2 = vpabsw_avx2(auVar2);
      *(undefined1 (*) [32])(local_c0 + lVar6) = auVar2;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x80);
    auVar2._8_8_ = uStack_98;
    auVar2._0_8_ = local_a0;
    auVar2._16_8_ = uStack_90;
    auVar2._24_8_ = uStack_88;
    auVar2 = vpaddw_avx2(auVar2,local_c0);
    auVar3._8_8_ = uStack_78;
    auVar3._0_8_ = local_80;
    auVar3._16_8_ = uStack_70;
    auVar3._24_8_ = uStack_68;
    auVar2 = vpaddw_avx2(auVar2,auVar3);
    auVar4._8_8_ = uStack_58;
    auVar4._0_8_ = local_60;
    auVar4._16_8_ = uStack_50;
    auVar4._24_8_ = uStack_48;
    auVar2 = vpaddw_avx2(auVar2,auVar4);
    auVar3 = vpunpcklwd_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar2 = vpunpckhwd_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar2 = vpaddd_avx2(auVar2,auVar3);
    alVar1 = (__m256i)vpaddd_avx2((undefined1  [32])alVar1,auVar2);
    *sad_acc = alVar1;
    src_ptr = (uint16_t *)((long)src_ptr + 0x80);
    ref_ptr = (uint16_t *)((long)ref_ptr + 0x80);
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + 1;
  } while (bVar7);
  return;
}

Assistant:

static void sad128x1(const uint16_t *src_ptr, const uint16_t *ref_ptr,
                     const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int i;
  for (i = 0; i < 2; i++) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + 32));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + 48));
    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 32));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 48));
    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 64;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);
    src_ptr += 64;
    ref_ptr += 64;
  }
}